

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

optional_ptr<duckdb::UsingColumnSet,_true> __thiscall
duckdb::BindContext::GetUsingBinding(BindContext *this,string *column_name)

{
  BindingAlias *pBVar1;
  iterator iVar2;
  optional_ptr<duckdb::UsingColumnSet,_true> oVar3;
  InternalException *this_00;
  BinderException *this_01;
  BindingAlias *binding;
  BindingAlias *this_02;
  long *plVar4;
  string result_bindings;
  string error;
  string local_50;
  
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->using_columns)._M_h,column_name);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    oVar3.ptr = (UsingColumnSet *)0x0;
  }
  else {
    if (1 < *(ulong *)((long)iVar2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_true>
                             ._M_cur + 0x40)) {
      ::std::operator+(&result_bindings,"Ambiguous column reference: column \"",column_name);
      ::std::operator+(&error,&result_bindings,"\" can refer to either:\n");
      ::std::__cxx11::string::~string((string *)&result_bindings);
      plVar4 = (long *)((long)iVar2.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_true>
                              ._M_cur + 0x38);
      while (plVar4 = (long *)*plVar4, plVar4 != (long *)0x0) {
        result_bindings._M_dataplus._M_p = (pointer)&result_bindings.field_2;
        result_bindings._M_string_length = 0;
        result_bindings.field_2._M_local_buf[0] = '\0';
        pBVar1 = *(BindingAlias **)(plVar4[1] + 0x68);
        for (this_02 = *(BindingAlias **)(plVar4[1] + 0x60); this_02 != pBVar1;
            this_02 = this_02 + 1) {
          if (result_bindings._M_string_length == 0) {
            ::std::__cxx11::string::assign((char *)&result_bindings);
          }
          else {
            ::std::__cxx11::string::append((char *)&result_bindings);
          }
          BindingAlias::GetAlias_abi_cxx11_(this_02);
          ::std::__cxx11::string::append((string *)&result_bindings);
          ::std::__cxx11::string::append((char *)&result_bindings);
          GetActualColumnName(&local_50,this,this_02,column_name);
          ::std::__cxx11::string::append((string *)&result_bindings);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        ::std::operator+(&local_50,&result_bindings,"]");
        ::std::__cxx11::string::append((string *)&error);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&result_bindings);
      }
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      BinderException::BinderException(this_01,&error);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(long *)((long)iVar2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_true>
                        ._M_cur + 0x38) == 0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&error,"Using binding found but no entries",(allocator *)&result_bindings
                );
      InternalException::InternalException(this_00,&error);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    oVar3.ptr = *(UsingColumnSet **)
                 (*(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_true>
                                  ._M_cur + 0x38) + 8);
  }
  return (optional_ptr<duckdb::UsingColumnSet,_true>)oVar3.ptr;
}

Assistant:

optional_ptr<UsingColumnSet> BindContext::GetUsingBinding(const string &column_name) {
	auto entry = using_columns.find(column_name);
	if (entry == using_columns.end()) {
		return nullptr;
	}
	auto &using_bindings = entry->second;
	if (using_bindings.size() > 1) {
		string error = "Ambiguous column reference: column \"" + column_name + "\" can refer to either:\n";
		for (auto &using_set_ref : using_bindings) {
			auto &using_set = using_set_ref.get();
			string result_bindings;
			for (auto &binding : using_set.bindings) {
				if (result_bindings.empty()) {
					result_bindings = "[";
				} else {
					result_bindings += ", ";
				}
				result_bindings += binding.GetAlias();
				result_bindings += ".";
				result_bindings += GetActualColumnName(binding, column_name);
			}
			error += result_bindings + "]";
		}
		throw BinderException(error);
	}
	for (auto &using_set : using_bindings) {
		return &using_set.get();
	}
	throw InternalException("Using binding found but no entries");
}